

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf128.c
# Opt level: O0

void cf_gf128_mul(uint32_t *x,uint32_t *y,uint32_t *out)

{
  int iStack_5c;
  uint8_t bit;
  uint32_t word;
  int i;
  cf_gf128 V;
  cf_gf128 Z;
  cf_gf128 zero;
  uint32_t *out_local;
  uint32_t *y_local;
  uint32_t *x_local;
  
  memset(Z + 2,0,0x10);
  memset(V + 2,0,0x10);
  _word = *(undefined8 *)y;
  V._0_8_ = *(undefined8 *)(y + 2);
  for (iStack_5c = 0; iStack_5c < 0x80; iStack_5c = iStack_5c + 1) {
    select_xor128(V + 2,Z + 2,&word,
                  (byte)(x[iStack_5c >> 5] >> (0x1f - ((byte)iStack_5c & 0x1f) & 0x1f)) & 1);
    cf_gf128_double_le(&word,&word);
  }
  *(undefined8 *)out = V._8_8_;
  *(undefined8 *)(out + 2) = Z._0_8_;
  return;
}

Assistant:

void cf_gf128_mul(const cf_gf128 x, const cf_gf128 y, cf_gf128 out)
{
#if CF_TIME_SIDE_CHANNEL_PROTECTION
  cf_gf128 zero = { 0 };
#endif

  /* Z_0 = 0^128
   * V_0 = Y */
  cf_gf128 Z, V;
  memset(Z, 0, sizeof Z);
  memcpy(V, y, sizeof V);

  int i;
  for (i = 0; i < 128; i++)
  {
    uint32_t word = x[i >> 5];
    uint8_t bit = (word >> (31 - (i & 31))) & 1;

#if CF_TIME_SIDE_CHANNEL_PROTECTION
    select_xor128(Z, zero, V, bit);
#else
    if (bit)
      xor_words(Z, V, 4);
#endif

    cf_gf128_double_le(V, V);
  }

  memcpy(out, Z, sizeof Z);
}